

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowingOverlay(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiSizeCallback p_Var4;
  char *label;
  ImGuiWindow *window;
  int n;
  ImVec2 *in_stack_00000068;
  ImGuiSelectableFlags in_stack_00000070;
  bool in_stack_00000077;
  char *in_stack_00000078;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003a4;
  bool *in_stack_000003a8;
  char *in_stack_000003b0;
  ImGuiWindow *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  void *in_stack_ffffffffffffff68;
  ImGuiSizeCallback in_stack_ffffffffffffff70;
  int count;
  ImVec2 *pIVar5;
  ImVec2 *this;
  float _x;
  ImVec2 local_60;
  ImGuiSizeCallback local_58;
  ImGuiWindow *local_50;
  int local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiViewport *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      pIVar2 = FindWindowByName((char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60
                                                ));
      local_8->NavWindowingList = pIVar2;
    }
    local_10 = GetMainViewport();
    pIVar5 = &local_18;
    ImVec2::ImVec2(pIVar5,(local_10->Size).x * 0.2,(local_10->Size).y * 0.2);
    this = &local_20;
    ImVec2::ImVec2(this,3.4028235e+38,3.4028235e+38);
    SetNextWindowSizeConstraints(this,pIVar5,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pIVar5 = &local_10->Pos;
    _x = 0.5;
    local_30 = ::operator*((ImVec2 *)in_stack_ffffffffffffff58,0.0);
    local_28 = ::operator+((ImVec2 *)in_stack_ffffffffffffff58,(ImVec2 *)0x1b48b8);
    ImVec2::ImVec2(&local_38,_x,_x);
    SetNextWindowPos(&local_28,1,&local_38);
    local_40 = ::operator*((ImVec2 *)in_stack_ffffffffffffff58,0.0);
    PushStyleVar((ImGuiStyleVar)_x,pIVar5);
    Begin(in_stack_000003b0,in_stack_000003a8,in_stack_000003a4);
    local_44 = (local_8->WindowsFocusOrder).Size;
    while( true ) {
      count = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      local_44 = local_44 + -1;
      if (local_44 < 0) break;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_8->WindowsFocusOrder,local_44);
      local_50 = *ppIVar3;
      bVar1 = IsWindowNavFocusable(local_50);
      if (bVar1) {
        in_stack_ffffffffffffff70 = (ImGuiSizeCallback)local_50->Name;
        local_58 = in_stack_ffffffffffffff70;
        p_Var4 = (ImGuiSizeCallback)
                 FindRenderedTextEnd((char *)in_stack_ffffffffffffff70,(char *)0x0);
        if (in_stack_ffffffffffffff70 == p_Var4) {
          local_58 = (ImGuiSizeCallback)
                     GetFallbackWindowNameForWindowingList(in_stack_ffffffffffffff58);
        }
        ImVec2::ImVec2(&local_60,0.0,0.0);
        Selectable(in_stack_00000078,in_stack_00000077,in_stack_00000070,in_stack_00000068);
      }
    }
    End();
    PopStyleVar(count);
  }
  return;
}

Assistant:

void ImGui::NavUpdateWindowingOverlay()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget != NULL);

    if (g.NavWindowingTimer < NAV_WINDOWING_LIST_APPEAR_DELAY)
        return;

    if (g.NavWindowingList == NULL)
        g.NavWindowingList = FindWindowByName("###NavWindowingList");
    ImGuiViewportP* viewport = /*g.NavWindow ? g.NavWindow->Viewport :*/ (ImGuiViewportP*)GetMainViewport();
    SetNextWindowSizeConstraints(ImVec2(viewport->Size.x * 0.20f, viewport->Size.y * 0.20f), ImVec2(FLT_MAX, FLT_MAX));
    SetNextWindowPos(viewport->Pos + viewport->Size * 0.5f, ImGuiCond_Always, ImVec2(0.5f, 0.5f));
    PushStyleVar(ImGuiStyleVar_WindowPadding, g.Style.WindowPadding * 2.0f);
    Begin("###NavWindowingList", NULL, ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings);
    for (int n = g.WindowsFocusOrder.Size - 1; n >= 0; n--)
    {
        ImGuiWindow* window = g.WindowsFocusOrder[n];
        if (!IsWindowNavFocusable(window))
            continue;
        const char* label = window->Name;
        if (label == FindRenderedTextEnd(label))
            label = GetFallbackWindowNameForWindowingList(window);
        Selectable(label, g.NavWindowingTarget == window);
    }
    End();
    PopStyleVar();
}